

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UI.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Sys::UI::del(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *__return_storage_ptr__,UI *this,Path *path)

{
  Client *client;
  Url UStack_38;
  
  client = *(Client **)this;
  getUrl(&UStack_38,this,path);
  HttpConsumer::del(__return_storage_ptr__,client,&UStack_38);
  std::__cxx11::string::~string((string *)&UStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::Sys::UI::del(const Path &path) {
  return HttpConsumer::del(client_, getUrl(path));
}